

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

cmJSONHelper<bool,_(anonymous_namespace)::ErrorCode> *
cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Bool
          (cmJSONHelper<bool,_(anonymous_namespace)::ErrorCode> *__return_storage_ptr__,
          ErrorCode success,ErrorCode fail,bool defval)

{
  anon_class_12_3_5a0d8fdd local_28;
  undefined1 local_19;
  ErrorCode local_18;
  ErrorCode EStack_14;
  bool defval_local;
  ErrorCode fail_local;
  ErrorCode success_local;
  
  local_28.success = success;
  local_28.fail = fail;
  local_28.defval = defval;
  local_19 = defval;
  local_18 = fail;
  EStack_14 = success;
  _fail_local = __return_storage_ptr__;
  std::function<(anonymous_namespace)::ErrorCode(bool&,Json::Value_const*)>::
  function<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Bool((anonymous_namespace)::ErrorCode,(anonymous_namespace)::ErrorCode,bool)::_lambda(bool&,Json::Value_const*)_1_,void>
            ((function<(anonymous_namespace)::ErrorCode(bool&,Json::Value_const*)> *)
             __return_storage_ptr__,&local_28);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<bool, E, CallState...> Bool(E success, E fail,
                                                  bool defval = false)
  {
    return [success, fail, defval](bool& out, const Json::Value* value,
                                   CallState&&... /*state*/) -> E {
      if (!value) {
        out = defval;
        return success;
      }
      if (!value->isBool()) {
        return fail;
      }
      out = value->asBool();
      return success;
    };
  }